

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_define_env.cpp
# Opt level: O3

void skiwi::global_define_environment_allocation
               (Program *prog,environment_map *env,repl_data *data,context *ctxt)

{
  pointer pvVar1;
  int iVar2;
  iterator __end2;
  iterator __begin2;
  pointer exp;
  global_define_env_visitor local_50;
  
  if (prog->alpha_converted != false) {
    local_50.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
    _vptr_base_visitor = (_func_int **)&PTR__previsit_002a1920;
    local_50.env.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.env.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (env->
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_50.env.
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(env->
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    local_50.rd = data;
    local_50.p_ctxt = ctxt;
    iVar2 = (*local_50.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
              _vptr_base_visitor[0x18])(&local_50,prog);
    if ((char)iVar2 != '\0') {
      exp = (prog->expressions).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (prog->expressions).
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (exp != pvVar1) {
        do {
          visitor<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_skiwi::(anonymous_namespace)::global_define_env_visitor>
          ::visit(exp,&local_50);
          exp = exp + 1;
        } while (exp != pvVar1);
      }
    }
    (*local_50.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
      _vptr_base_visitor[0x31])(&local_50,prog);
    prog->global_define_env_allocated = true;
    local_50.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
    _vptr_base_visitor = (_func_int **)&PTR__previsit_002a1920;
    if (local_50.env.
        super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.env.
                 super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  __assert_fail("prog.alpha_converted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/global_define_env.cpp"
                ,0x22,
                "void skiwi::global_define_environment_allocation(Program &, environment_map &, repl_data &, context &)"
               );
}

Assistant:

void global_define_environment_allocation(Program& prog, environment_map& env, repl_data& data, context& ctxt)
  {
  assert(prog.alpha_converted);
  global_define_env_visitor gdev;
  gdev.env = env;
  gdev.rd = &data;
  gdev.p_ctxt = &ctxt;
  visitor<Program, global_define_env_visitor>::visit(prog, &gdev);
  prog.global_define_env_allocated = true;
  }